

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Statement * inputStatement(void)

{
  Token t;
  Token t_00;
  int iVar1;
  TokenType TVar2;
  Statement *pSVar3;
  StatementType *pSVar4;
  Statement *in_RDI;
  undefined8 in_stack_ffffffffffffff68;
  Statement *s;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 uStack_1c;
  Input i;
  
  in_RDI->type = STATEMENT_INPUT;
  iVar1 = presentLine();
  (in_RDI->field_1).blockStatement.numStatements = iVar1;
  (in_RDI->field_1).blockStatement.blockName = BLOCK_IF;
  (in_RDI->field_1).blockStatement.statements = (Statement *)0x0;
  do {
    (in_RDI->field_1).blockStatement.blockName =
         (in_RDI->field_1).blockStatement.blockName + BLOCK_ELSE;
    pSVar3 = (Statement *)
             realloc((in_RDI->field_1).blockStatement.statements,
                     (long)(in_RDI->field_1).printStatement.argCount * 0x18);
    (in_RDI->field_1).blockStatement.statements = pSVar3;
    TVar2 = peek();
    if (TVar2 == TOKEN_STRING) {
      local_20 = 0;
      advance();
      t.start = (char *)local_30;
      t._0_8_ = local_38;
      t.file = (char *)local_28;
      t.length = (int)in_stack_ffffffffffffff68;
      t.line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      i._0_8_ = stringOf(t);
LAB_00106246:
      pSVar4 = &((in_RDI->field_1).blockStatement.statements)->type +
               (long)(int)((in_RDI->field_1).blockStatement.blockName - BLOCK_ELSE) * 6;
      *(ulong *)pSVar4 = CONCAT44(uStack_1c,local_20);
      *(undefined8 *)(pSVar4 + 2) = i._0_8_;
      *(char **)(pSVar4 + 4) = i.field_1.prompt;
    }
    else {
      TVar2 = peek();
      if (TVar2 == TOKEN_IDENTIFIER) {
        local_20 = 1;
        advance();
        t_00.start = (char *)local_50;
        t_00._0_8_ = local_58;
        t_00.file = (char *)local_48;
        t_00.length = (int)in_stack_ffffffffffffff68;
        t_00.line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        i.field_1.prompt = stringOf(t_00);
        i._0_8_ = i._0_8_ & 0xffffffff00000000;
        iVar1 = match(TOKEN_COLON);
        if (iVar1 != 0) {
          iVar1 = match(TOKEN_INT);
          if (iVar1 == 0) {
            iVar1 = match(TOKEN_FLOAT);
            if (iVar1 == 0) {
              printf("\x1b[31m\n[Error] [Line:%d] Bad input format specifier!\x1b[0m",
                     (ulong)(in_RDI->field_1).breakStatement.pos.type);
              he = he + 1;
            }
            else {
              i.type = 2;
            }
          }
          else {
            i.type = INPUT_IDENTIFER;
          }
        }
        goto LAB_00106246;
      }
      printf("\x1b[31m\n[Error] [Line:%d] Bad input statement!\x1b[0m",
             (ulong)(in_RDI->field_1).breakStatement.pos.type);
      he = he + 1;
    }
    iVar1 = match(TOKEN_COMMA);
    if (iVar1 == 0) {
      consume((Token *)&s,TOKEN_NEWLINE,"Expected newline after Input!");
      return in_RDI;
    }
  } while( true );
}

Assistant:

static Statement inputStatement(){
    Statement s;
    s.type = STATEMENT_INPUT;
    debug("Parsing input statement");
    s.inputStatement.line = presentLine();
    s.inputStatement.count = 0;
    s.inputStatement.inputs = 0;
    do{
        s.inputStatement.count++;
        s.inputStatement.inputs = (Input *)reallocate(s.inputStatement.inputs, sizeof(Input) * s.inputStatement.count);
        Input i;
        if(peek() == TOKEN_STRING){
            i.type = INPUT_PROMPT;
            i.prompt = stringOf(advance());
        }
        else if(peek() == TOKEN_IDENTIFIER){
            i.type = INPUT_IDENTIFER;
            i.identifer = stringOf(advance());
            i.datatype = INPUT_ANY;
            if(match(TOKEN_COLON)){
                if(match(TOKEN_INT))
                    i.datatype = INPUT_INT;
                else if(match(TOKEN_FLOAT))
                    i.datatype = INPUT_FLOAT;
                else{
                    printf(line_error("Bad input format specifier!"), s.inputStatement.line);
                    he++;
                }
            }
        }
        else{
            printf(line_error("Bad input statement!"), s.inputStatement.line);
            he++;
            continue;
        }
        s.inputStatement.inputs[s.inputStatement.count - 1] = i;
    } while(match(TOKEN_COMMA));

    consume(TOKEN_NEWLINE, "Expected newline after Input!");
    return s;
}